

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int checkparts(CURLU *u,char *in,char *wanted,uint getflags)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t n;
  char *p;
  part parts [10];
  size_t len;
  char *bufp;
  char buf [256];
  int local_30;
  CURLUcode rc;
  int i;
  uint getflags_local;
  char *wanted_local;
  char *in_local;
  CURLU *u_local;
  
  len = (size_t)&bufp;
  parts[9].name = (char *)0x100;
  memcpy(&p,&DAT_00108d00,0xa0);
  bufp._0_1_ = '\0';
  for (local_30 = 0; *(long *)(parts + local_30) != 0; local_30 = local_30 + 1) {
    n = 0;
    buf._252_4_ = curl_url_get(u,*(undefined4 *)&parts[(long)local_30 + -1].name,&n,getflags);
    if ((buf._252_4_ == 0) && (n != 0)) {
      pcVar3 = "";
      if ((char)bufp != '\0') {
        pcVar3 = " | ";
      }
      curl_msnprintf(len,parts[9].name,"%s%s",pcVar3,n);
    }
    else {
      pcVar3 = "";
      if ((char)bufp != '\0') {
        pcVar3 = " | ";
      }
      curl_msnprintf(len,parts[9].name,"%s[%d]",pcVar3,buf._252_4_);
    }
    sVar2 = strlen((char *)len);
    len = sVar2 + len;
    parts[9].name = parts[9].name + -sVar2;
    curl_free(n);
  }
  iVar1 = strcmp((char *)&bufp,wanted);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"in: %s\nwanted: %s\ngot:    %s\n",in,wanted,&bufp);
  }
  u_local._4_4_ = (uint)(iVar1 != 0);
  return u_local._4_4_;
}

Assistant:

static int checkparts(CURLU *u, const char *in, const char *wanted,
                      unsigned int getflags)
{
  int i;
  CURLUcode rc;
  char buf[256];
  char *bufp = &buf[0];
  size_t len = sizeof(buf);
  struct part parts[] = {
    {CURLUPART_SCHEME, "scheme"},
    {CURLUPART_USER, "user"},
    {CURLUPART_PASSWORD, "password"},
    {CURLUPART_OPTIONS, "options"},
    {CURLUPART_HOST, "host"},
    {CURLUPART_PORT, "port"},
    {CURLUPART_PATH, "path"},
    {CURLUPART_QUERY, "query"},
    {CURLUPART_FRAGMENT, "fragment"},
    {0, NULL}
  };
  buf[0] = 0;

  for(i = 0; parts[i].name; i++) {
    char *p = NULL;
    size_t n;
    rc = curl_url_get(u, parts[i].part, &p, getflags);
    if(!rc && p) {
      snprintf(bufp, len, "%s%s", buf[0]?" | ":"", p);
    }
    else
      snprintf(bufp, len, "%s[%d]", buf[0]?" | ":"", (int)rc);

    n = strlen(bufp);
    bufp += n;
    len -= n;
    curl_free(p);
  }
  if(strcmp(buf, wanted)) {
    fprintf(stderr, "in: %s\nwanted: %s\ngot:    %s\n", in, wanted, buf);
    return 1;
  }
  return 0;
}